

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glcViewportArrayTests.cpp
# Opt level: O2

void __thiscall
glcts::ViewportArray::DrawTestBase::setup4x4Viewport(DrawTestBase *this,VIEWPORT_METHOD method)

{
  GLuint y;
  int iVar1;
  deUint32 dVar2;
  undefined4 extraout_var;
  TestError *this_00;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  GLfloat *pGVar8;
  GLuint i;
  ulong uVar9;
  GLfloat data [64];
  long lVar3;
  
  pGVar8 = data;
  iVar1 = (*((this->super_TestCaseBase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar3 = CONCAT44(extraout_var,iVar1);
  iVar4 = 0;
  for (iVar1 = 0; iVar1 != 4; iVar1 = iVar1 + 1) {
    iVar6 = iVar4 * 4;
    iVar5 = 0;
    for (iVar7 = 0; iVar7 != 0x10; iVar7 = iVar7 + 4) {
      data[iVar6 + iVar7] = (float)iVar5 * 32.0;
      data[iVar6 + 1 + iVar7] = (float)iVar1 * 32.0;
      data[iVar6 + 2 + iVar7] = 32.0;
      data[iVar6 + iVar7 + 3] = 32.0;
      iVar5 = iVar5 + 1;
    }
    iVar4 = iVar4 + iVar5;
  }
  if (method == VIEWPORTARRAYV) {
    (**(code **)(lVar3 + 0x1a08))(0,0x10,data);
    dVar2 = (**(code **)(lVar3 + 0x800))();
    glu::checkError(dVar2,"ViewportArrayv",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/common/glcViewportArrayTests.cpp"
                    ,0xc96);
  }
  else if (method == VIEWPORTINDEXEDF) {
    pGVar8 = data + 3;
    for (uVar9 = 0; uVar9 != 0x10; uVar9 = uVar9 + 1) {
      (**(code **)(lVar3 + 0x1a10))(pGVar8[-3],pGVar8[-2],pGVar8[-1],*pGVar8,uVar9 & 0xffffffff);
      dVar2 = (**(code **)(lVar3 + 0x800))();
      glu::checkError(dVar2,"ViewportIndexedf",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/common/glcViewportArrayTests.cpp"
                      ,0xca1);
      pGVar8 = pGVar8 + 4;
    }
  }
  else {
    if (method != VIEWPORTINDEXEDF_V) {
      this_00 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (this_00,"Invalid enum",(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/common/glcViewportArrayTests.cpp"
                 ,0xcac);
      __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
    }
    for (uVar9 = 0; uVar9 != 0x10; uVar9 = uVar9 + 1) {
      (**(code **)(lVar3 + 0x1a18))(uVar9 & 0xffffffff,pGVar8);
      dVar2 = (**(code **)(lVar3 + 0x800))();
      glu::checkError(dVar2,"ViewportIndexedfv",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/common/glcViewportArrayTests.cpp"
                      ,0xca8);
      pGVar8 = (GLfloat *)((long)pGVar8 + 0x10);
    }
  }
  return;
}

Assistant:

void DrawTestBase::setup4x4Viewport(VIEWPORT_METHOD method)
{
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	GLint   index = 0;
	GLfloat data[16 * 4 /* 4x4 * (x + y + w + h) */];

	GLfloat width  = (GLfloat)(m_width / 4);
	GLfloat height = (GLfloat)(m_height / 4);

	for (GLuint y = 0; y < 4; ++y)
	{
		for (GLuint x = 0; x < 4; ++x)
		{
			data[index * 4 + 0] = (GLfloat)((GLfloat)x * width);
			data[index * 4 + 1] = (GLfloat)((GLfloat)y * height);
			data[index * 4 + 2] = width;
			data[index * 4 + 3] = height;

			index += 1;
		}
	}

	switch (method)
	{
	case VIEWPORTARRAYV:
		gl.viewportArrayv(0 /* first */, 16 /*count */, data);
		GLU_EXPECT_NO_ERROR(gl.getError(), "ViewportArrayv");
		break;
	case VIEWPORTINDEXEDF:
		for (GLuint i = 0; i < 16; ++i)
		{
			const GLfloat x = data[i * 4 + 0];
			const GLfloat y = data[i * 4 + 1];
			const GLfloat w = data[i * 4 + 2];
			const GLfloat h = data[i * 4 + 3];

			gl.viewportIndexedf(i, x, y, w, h);
			GLU_EXPECT_NO_ERROR(gl.getError(), "ViewportIndexedf");
		}
		break;
	case VIEWPORTINDEXEDF_V:
		for (GLuint i = 0; i < 16; ++i)
		{
			gl.viewportIndexedfv(i, &data[i * 4]);
			GLU_EXPECT_NO_ERROR(gl.getError(), "ViewportIndexedfv");
		}
		break;
	default:
		TCU_FAIL("Invalid enum");
	}
}